

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void roundFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMVar1;
  uint uVar2;
  int length;
  i64 iVar3;
  char *z;
  uint uVar4;
  double rVal;
  double local_28;
  
  uVar4 = 0;
  if (argc == 2) {
    pMVar1 = argv[1];
    uVar4._0_2_ = pMVar1->flags;
    uVar4._2_1_ = pMVar1->enc;
    uVar4._3_1_ = pMVar1->eSubtype;
    if ((0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) != 0) {
      return;
    }
    iVar3 = sqlite3VdbeIntValue(pMVar1);
    uVar2 = 0x1e;
    if ((int)(uint)iVar3 < 0x1e) {
      uVar2 = (uint)iVar3;
    }
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
  }
  pMVar1 = *argv;
  uVar2._0_2_ = pMVar1->flags;
  uVar2._2_1_ = pMVar1->enc;
  uVar2._3_1_ = pMVar1->eSubtype;
  if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) != 0) {
    return;
  }
  local_28 = sqlite3VdbeRealValue(pMVar1);
  if (((uVar4 != 0) || (local_28 < 0.0)) || (9.223372036854776e+18 <= local_28)) {
    if (((uVar4 != 0) || (0.0 <= local_28)) || (local_28 <= -9.223372036854776e+18)) {
      z = sqlite3_mprintf("%.*f",(ulong)uVar4);
      if (z == (char *)0x0) {
        sqlite3_result_error_nomem(context);
        return;
      }
      length = sqlite3Strlen30(z);
      sqlite3AtoF(z,&local_28,length,'\x01');
      sqlite3_free(z);
      rVal = local_28;
    }
    else {
      rVal = -(double)(long)(0.5 - local_28);
    }
  }
  else {
    rVal = (double)(long)(local_28 + 0.5);
  }
  sqlite3_result_double(context,rVal);
  return;
}

Assistant:

static void roundFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  int n = 0;
  double r;
  char *zBuf;
  assert( argc==1 || argc==2 );
  if( argc==2 ){
    if( SQLITE_NULL==sqlite3_value_type(argv[1]) ) return;
    n = sqlite3_value_int(argv[1]);
    if( n>30 ) n = 30;
    if( n<0 ) n = 0;
  }
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  r = sqlite3_value_double(argv[0]);
  /* If Y==0 and X will fit in a 64-bit int,
  ** handle the rounding directly,
  ** otherwise use printf.
  */
  if( n==0 && r>=0 && r<LARGEST_INT64-1 ){
    r = (double)((sqlite_int64)(r+0.5));
  }else if( n==0 && r<0 && (-r)<LARGEST_INT64-1 ){
    r = -(double)((sqlite_int64)((-r)+0.5));
  }else{
    zBuf = sqlite3_mprintf("%.*f",n,r);
    if( zBuf==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
    sqlite3AtoF(zBuf, &r, sqlite3Strlen30(zBuf), SQLITE_UTF8);
    sqlite3_free(zBuf);
  }
  sqlite3_result_double(context, r);
}